

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O1

void range_test(void)

{
  filemgr_ops *ops;
  btree_blk_ops *blk_ops;
  btree_kv_ops *kv_ops;
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  filemgr_open_result fVar4;
  uint64_t key;
  filemgr *local_170;
  uint64_t key_end;
  uint64_t value;
  timeval __test_begin;
  btree btree;
  btreeblk_handle bhandle;
  filemgr_config fconfig;
  
  uVar3 = 0;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fconfig.flag = 0;
  fconfig.chunksize = 0;
  fconfig.prefetch_duration = 0;
  fconfig.encryption_key.bytes[0] = '\0';
  fconfig.encryption_key.bytes[1] = '\0';
  fconfig.encryption_key.bytes[2] = '\0';
  fconfig.encryption_key.bytes[3] = '\0';
  fconfig.encryption_key.bytes[4] = '\0';
  fconfig.encryption_key.bytes[5] = '\0';
  fconfig.encryption_key.bytes[6] = '\0';
  fconfig.encryption_key.bytes[7] = '\0';
  fconfig.encryption_key.bytes[8] = '\0';
  fconfig.encryption_key.bytes[9] = '\0';
  fconfig.encryption_key.bytes[10] = '\0';
  fconfig.encryption_key.bytes[0xb] = '\0';
  fconfig.encryption_key.bytes[0xc] = '\0';
  fconfig.encryption_key.bytes[0xd] = '\0';
  fconfig.encryption_key.bytes[0xe] = '\0';
  fconfig.encryption_key.bytes[0xf] = '\0';
  fconfig.encryption_key.bytes[0x10] = '\0';
  fconfig.encryption_key.bytes[0x11] = '\0';
  fconfig.encryption_key.bytes[0x12] = '\0';
  fconfig.encryption_key.bytes[0x13] = '\0';
  fconfig.encryption_key.bytes[0x14] = '\0';
  fconfig.encryption_key.bytes[0x15] = '\0';
  fconfig.encryption_key.bytes[0x16] = '\0';
  fconfig.encryption_key.bytes[0x17] = '\0';
  fconfig.encryption_key.bytes[0x18] = '\0';
  fconfig.encryption_key.bytes[0x19] = '\0';
  fconfig.encryption_key.bytes[0x1a] = '\0';
  fconfig.encryption_key.bytes[0x1b] = '\0';
  fconfig.encryption_key.bytes[0x1c] = '\0';
  fconfig.encryption_key.bytes[0x1d] = '\0';
  fconfig.encryption_key.bytes[0x1e] = '\0';
  fconfig.encryption_key.bytes[0x1f] = '\0';
  fconfig.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fconfig.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fconfig.do_not_cache_doc_blocks = false;
  fconfig._89_3_ = 0;
  fconfig.num_blocks_readahead = 0;
  fconfig.blocksize = 0x200;
  fconfig.ncacheblock = 0;
  fconfig.options = '\b';
  fconfig.seqtree_opt = '\0';
  fconfig._18_6_ = 0;
  fconfig.num_wal_shards = 8;
  fconfig.num_bcache_shards = 0;
  fconfig.encryption_key.algorithm = 0;
  system("rm -rf  btreeblock_testfile");
  ops = get_filemgr_ops();
  fVar4 = filemgr_open("./btreeblock_testfile",ops,&fconfig,(err_log_callback *)0x0);
  local_170 = fVar4.file;
  btreeblk_init(&bhandle,local_170,0x200);
  blk_ops = btreeblk_get_ops();
  kv_ops = btree_kv_get_ku64_vu64();
  btree_init(&btree,&bhandle,blk_ops,kv_ops,0x200,'\b','\b',0,(btree_meta *)0x0);
  uVar2 = 0;
  do {
    key = uVar2;
    value = uVar3;
    btree_insert(&btree,&key,&value);
    btreeblk_end(&bhandle);
    uVar2 = uVar2 + 1;
    uVar3 = uVar3 + 10;
  } while (uVar2 != 0x10);
  iVar1 = 0;
  do {
    btree_get_key_range(&btree,(idx_t)iVar1,5,&key,&key_end);
    printf("%d %d\n",key & 0xffffffff,(ulong)(uint)key_end);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 5);
  btreeblk_free(&bhandle);
  filemgr_close(local_170,true,(char *)0x0,(err_log_callback *)0x0);
  filemgr_shutdown();
  fprintf(_stderr,"%s PASSED\n","range test");
  return;
}

Assistant:

void range_test()
{
    TEST_INIT();

    int i, r, n=16, den=5;
    int blocksize = 512;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree btree;
    struct filemgr_config fconfig;
    uint64_t key, value, key_end;
    char *fname = (char *) "./btreeblock_testfile";

    memset(&fconfig, 0, sizeof(fconfig));
    fconfig.blocksize = blocksize;
    fconfig.ncacheblock = 0;
    fconfig.options = FILEMGR_CREATE;
    fconfig.num_wal_shards = 8;

    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);

    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), btree_kv_get_ku64_vu64(),
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);

    for (i=0;i<n;++i){
        key = i;
        value = i*10;
        btree_insert(&btree, (void*)&key, (void*)&value);
        btreeblk_end(&bhandle);
    }

    for (i=0;i<den;++i){
        btree_get_key_range(&btree, i, den, (void*)&key, (void*)&key_end);
        DBG("%d %d\n", (int)key, (int)key_end);
    }

    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    TEST_RESULT("range test");
}